

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdKelvinViewportScale::emulate_mthd(MthdKelvinViewportScale *this)

{
  pgraph_state *state;
  _Bool _Var1;
  uint32_t a;
  int comp;
  uint32_t which;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_kelvin_check_err19(state);
  _Var1 = pgraph_in_begin_end(state);
  if (_Var1) {
    MthdTest::warn((MthdTest *)this,4);
    return;
  }
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    return;
  }
  comp = *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
  a = (this->super_SingleMthdTest).super_MthdTest.val;
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type == 0x20) {
    which = 0x3a;
  }
  else {
    pgraph_ld_ltctx(state,0x37,comp,a);
    a = (this->super_SingleMthdTest).super_MthdTest.val;
    comp = *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
    which = 0x76;
  }
  pgraph_ld_xfctx(state,which,comp,a);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		uint32_t err = 0;
		if (pgraph_in_begin_end(&exp))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!exp.nsource) {
				if (chipset.card_type == 0x20) {
					pgraph_ld_xfctx(&exp, 0x3a, idx, val);
				} else {
					pgraph_ld_ltctx(&exp, 0x37, idx, val);
					pgraph_ld_xfctx(&exp, 0x76, idx, val);
				}
			}
		}
	}